

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O0

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::SetNrAgents::operator()
          (SetNrAgents *this,iterator_t *first,iterator_t *last)

{
  uint uVar1;
  ostream *poVar2;
  EParse *this_00;
  long *in_RDI;
  size_t nrA;
  stringstream msg;
  stringstream *in_stack_fffffffffffffe08;
  ostream *in_stack_fffffffffffffe10;
  stringstream local_1a0 [16];
  ostream local_190 [120];
  size_t in_stack_fffffffffffffee8;
  MultiAgentDecisionProcess *in_stack_fffffffffffffef0;
  
  if (*(int *)(*in_RDI + 0x40) != 2) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,
                             "SetNrAgents::operator()(iterator_t first, iterator_t last) requires that last parsed element is a UINT!"
                            );
    std::operator<<(poVar2,"(at ");
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::get_position(*(position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
                     **)(*in_RDI + 0x150));
    poVar2 = DPOMDPFormatParsing::operator<<
                       (in_stack_fffffffffffffe10,(file_position *)in_stack_fffffffffffffe08);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_00 = (EParse *)__cxa_allocate_exception(0x28);
    EParse::EParse(this_00,in_stack_fffffffffffffe08);
    __cxa_throw(this_00,&EParse::typeinfo,EParse::~EParse);
  }
  uVar1 = *(uint *)(*in_RDI + 0x10);
  GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
  MultiAgentDecisionProcess::SetNrAgents(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  *(ulong *)(*in_RDI + 0x48) = (ulong)uVar1;
  return;
}

Assistant:

void ParserDPOMDPFormat_Spirit::SetNrAgents::operator()(iterator_t first, iterator_t last) const
{    
    if (_m_po->_m_lp_type != UINT)
    {
        stringstream msg;
        msg << "SetNrAgents::operator()(iterator_t first, iterator_t last) requires that last parsed element is a UINT!"<<
            "(at " << _m_po->_m_first->get_position() << ")" << endl;
        throw EParse(msg);
    }
    size_t nrA = _m_po->_m_lp_uint;
    if(DEBUG_PARSE){cout <<"agt_SetNrAgents - nrA="<<nrA<<endl;} 
    _m_po->GetDecPOMDPDiscrete()->SetNrAgents(nrA);
    _m_po->_m_nrA = nrA;
}